

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalNearTrim(int nNear,char *aTmp,char **paPoslist,int *pnToken,Fts3Phrase *pPhrase)

{
  char *pcVar1;
  Fts3Phrase *pFVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  char **ppPoslist;
  char *pOut;
  char *local_70;
  char *local_68;
  Fts3Phrase *local_60;
  int *local_58;
  char *local_50;
  char *p2;
  char *pTmp2;
  char *pTmp1;
  
  iVar4 = *pnToken;
  pcVar1 = (pPhrase->doclist).pList;
  local_50 = *paPoslist;
  pOut = pcVar1;
  local_68 = aTmp;
  local_60 = pPhrase;
  local_58 = pnToken;
  p2 = pcVar1;
  pTmp1 = aTmp;
  fts3PoslistPhraseMerge(&pTmp1,pPhrase->nToken + nNear,0,0,paPoslist,&p2);
  pcVar3 = pTmp1;
  pTmp2 = pTmp1;
  local_70 = pTmp1;
  *paPoslist = local_50;
  p2 = pcVar1;
  fts3PoslistPhraseMerge(&pTmp2,nNear + iVar4,1,0,&p2,paPoslist);
  if (pcVar3 == aTmp) {
    if (pTmp2 == aTmp) {
      return 0;
    }
    ppPoslist = &local_70;
  }
  else {
    ppPoslist = &local_68;
    if (pTmp2 != pcVar3) {
      fts3PoslistMerge(&pOut,ppPoslist,&local_70);
      goto LAB_001a8ab7;
    }
  }
  fts3PoslistCopy(&pOut,ppPoslist);
LAB_001a8ab7:
  pFVar2 = local_60;
  pcVar1 = (local_60->doclist).pList;
  lVar5 = (long)((int)pOut - (int)pcVar1) + -1;
  iVar4 = (int)lVar5;
  memset(pcVar1 + iVar4,0,(local_60->doclist).nList - lVar5);
  (pFVar2->doclist).nList = iVar4;
  *paPoslist = (pFVar2->doclist).pList;
  *local_58 = pFVar2->nToken;
  return 1;
}

Assistant:

static int fts3EvalNearTrim(
  int nNear,                      /* NEAR distance. As in "NEAR/nNear". */
  char *aTmp,                     /* Temporary space to use */
  char **paPoslist,               /* IN/OUT: Position list */
  int *pnToken,                   /* IN/OUT: Tokens in phrase of *paPoslist */
  Fts3Phrase *pPhrase             /* The phrase object to trim the doclist of */
){
  int nParam1 = nNear + pPhrase->nToken;
  int nParam2 = nNear + *pnToken;
  int nNew;
  char *p2; 
  char *pOut; 
  int res;

  assert( pPhrase->doclist.pList );

  p2 = pOut = pPhrase->doclist.pList;
  res = fts3PoslistNearMerge(
    &pOut, aTmp, nParam1, nParam2, paPoslist, &p2
  );
  if( res ){
    nNew = (int)(pOut - pPhrase->doclist.pList) - 1;
    assert( pPhrase->doclist.pList[nNew]=='\0' );
    assert( nNew<=pPhrase->doclist.nList && nNew>0 );
    memset(&pPhrase->doclist.pList[nNew], 0, pPhrase->doclist.nList - nNew);
    pPhrase->doclist.nList = nNew;
    *paPoslist = pPhrase->doclist.pList;
    *pnToken = pPhrase->nToken;
  }

  return res;
}